

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-view.h
# Opt level: O2

string * __thiscall
wabt::operator+[abi_cxx11_(string *__return_storage_ptr__,wabt *this,char *x,string_view y)

{
  char *pcVar1;
  size_type in_R9;
  string_view x_00;
  string_view y_00;
  
  pcVar1 = (char *)strlen((char *)this);
  x_00.size_ = (size_type)x;
  x_00.data_ = pcVar1;
  y_00.size_ = in_R9;
  y_00.data_ = y.data_;
  operator+[abi_cxx11_(__return_storage_ptr__,this,x_00,y_00);
  return __return_storage_ptr__;
}

Assistant:

inline std::string operator+(const char* x, string_view y) {
  return string_view(x) + y;
}